

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void kratos::LatchVisitor::check_combinational(CombinationalStmtBlock *stmt)

{
  size_type *psVar1;
  undefined1 local_a0 [8];
  AssignedVarVisitor visitor;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_a0 = (undefined1  [8])&PTR_visit_root_002b8988;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.assigned_vars_._M_h._M_rehash_policy._M_next_resize;
  visitor.assigned_vars_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.assigned_vars_._M_h._M_bucket_count = 0;
  visitor.assigned_vars_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.assigned_vars_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.assigned_vars_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.assigned_vars_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.assigned_vars_._M_h._M_rehash_policy._M_next_resize = 0;
  IRVisitor::visit_root((IRVisitor *)local_a0,(IRNode *)stmt);
  psVar1 = &visitor.assigned_vars_._M_h._M_bucket_count;
  while (psVar1 = (size_type *)*psVar1, psVar1 != (size_type *)0x0) {
    check_stmt_block(&stmt->super_StmtBlock,(Var *)((__node_base *)(psVar1 + 1))->_M_nxt,
                     (vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)(psVar1 + 2),true);
  }
  AssignedVarVisitor::~AssignedVarVisitor((AssignedVarVisitor *)local_a0);
  return;
}

Assistant:

void static check_combinational(CombinationalStmtBlock* stmt) {
        AssignedVarVisitor visitor;
        visitor.visit_root(stmt);
        const auto& vars = visitor.assigned_vars();
        for (auto const& iter : vars) {
            check_stmt_block(stmt, iter.first, iter.second, true);
        }
    }